

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O0

crn_format
crnlib::pixel_format_helpers::convert_pixel_format_to_best_crn_format(pixel_format crn_fmt)

{
  crn_format local_18;
  crn_format fmt;
  pixel_format crn_fmt_local;
  
  if (crn_fmt == PIXEL_FMT_ETC1) {
    local_18 = cCRNFmtETC1;
  }
  else if (crn_fmt == PIXEL_FMT_DXT5A) {
    local_18 = cCRNFmtDXT5A;
  }
  else {
    if (crn_fmt != PIXEL_FMT_DXT1) {
      if (crn_fmt == PIXEL_FMT_ETC2) {
        return cCRNFmtETC2;
      }
      if (crn_fmt == PIXEL_FMT_3DC) {
        return cCRNFmtDXN_YX;
      }
      if ((((crn_fmt == PIXEL_FMT_DXT2) || (crn_fmt == PIXEL_FMT_DXT3)) ||
          (crn_fmt == PIXEL_FMT_DXT4)) || (crn_fmt == PIXEL_FMT_DXT5)) {
        return cCRNFmtDXT5;
      }
      if (crn_fmt != PIXEL_FMT_DXT1A) {
        if (crn_fmt == PIXEL_FMT_ETC2A) {
          return cCRNFmtETC2A;
        }
        if (((crn_fmt == PIXEL_FMT_A8R8G8B8) || (crn_fmt == PIXEL_FMT_A8L8)) ||
           (crn_fmt == PIXEL_FMT_A8)) {
          return cCRNFmtDXT5;
        }
        if (crn_fmt == PIXEL_FMT_DXT5_AGBR) {
          return cCRNFmtDXT5_AGBR;
        }
        if (crn_fmt == PIXEL_FMT_DXT5_xGBR) {
          return cCRNFmtDXT5_xGBR;
        }
        if (crn_fmt == PIXEL_FMT_DXT5_xGxR) {
          return cCRNFmtDXT5_xGxR;
        }
        if (crn_fmt == PIXEL_FMT_ETC1S) {
          return cCRNFmtETC1S;
        }
        if (crn_fmt == PIXEL_FMT_ETC2AS) {
          return cCRNFmtETC2AS;
        }
        if (crn_fmt != PIXEL_FMT_DXN) {
          if (crn_fmt == PIXEL_FMT_DXT5_CCxY) {
            return cCRNFmtDXT5_CCxY;
          }
          if ((crn_fmt != PIXEL_FMT_R8G8B8) && (crn_fmt != PIXEL_FMT_L8)) {
            return cCRNFmtDXT1;
          }
          return cCRNFmtDXT1;
        }
        return cCRNFmtDXN_XY;
      }
    }
    local_18 = cCRNFmtDXT1;
  }
  return local_18;
}

Assistant:

crn_format convert_pixel_format_to_best_crn_format(pixel_format crn_fmt)
        {
            crn_format fmt = cCRNFmtDXT1;
            switch (crn_fmt)
            {
            case PIXEL_FMT_DXT1:
            case PIXEL_FMT_DXT1A:
                fmt = cCRNFmtDXT1;
                break;
            case PIXEL_FMT_DXT2:
            case PIXEL_FMT_DXT3:
            case PIXEL_FMT_DXT4:
            case PIXEL_FMT_DXT5:
                fmt = cCRNFmtDXT5;
                break;
            case PIXEL_FMT_3DC:
                fmt = cCRNFmtDXN_YX;
                break;
            case PIXEL_FMT_DXN:
                fmt = cCRNFmtDXN_XY;
                break;
            case PIXEL_FMT_DXT5A:
                fmt = cCRNFmtDXT5A;
                break;
            case PIXEL_FMT_R8G8B8:
            case PIXEL_FMT_L8:
                fmt = cCRNFmtDXT1;
                break;
            case PIXEL_FMT_A8R8G8B8:
            case PIXEL_FMT_A8:
            case PIXEL_FMT_A8L8:
                fmt = cCRNFmtDXT5;
                break;
            case PIXEL_FMT_DXT5_CCxY:
                fmt = cCRNFmtDXT5_CCxY;
                break;
            case PIXEL_FMT_DXT5_xGBR:
                fmt = cCRNFmtDXT5_xGBR;
                break;
            case PIXEL_FMT_DXT5_AGBR:
                fmt = cCRNFmtDXT5_AGBR;
                break;
            case PIXEL_FMT_DXT5_xGxR:
                fmt = cCRNFmtDXT5_xGxR;
                break;
            case PIXEL_FMT_ETC1:
                fmt = cCRNFmtETC1;
                break;
            case PIXEL_FMT_ETC2:
                fmt = cCRNFmtETC2;
                break;
            case PIXEL_FMT_ETC2A:
                fmt = cCRNFmtETC2A;
                break;
            case PIXEL_FMT_ETC1S:
                fmt = cCRNFmtETC1S;
                break;
            case PIXEL_FMT_ETC2AS:
                fmt = cCRNFmtETC2AS;
                break;
            default: {
                CRNLIB_ASSERT(false);
                break;
            }
            }
            return fmt;
        }